

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-wrap.cpp
# Opt level: O3

bool get_current_dms_text_descriptor(MXFWriter *writer,GenericStreamTextBasedSet **text_object)

{
  long ***ppplVar1;
  long **pplVar2;
  MDD_t MVar3;
  long *plVar4;
  undefined8 uVar5;
  GenericStreamTextBasedSet *pGVar6;
  long ***ppplVar7;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  object_list;
  long **local_a0;
  long **local_98;
  undefined8 local_90;
  Result_t local_88 [104];
  
  local_a0 = (long **)&local_a0;
  local_90 = 0;
  local_98 = local_a0;
  plVar4 = (long *)(**(code **)(*(long *)writer + 0x10))();
  MVar3 = ASDCP::DefaultSMPTEDict();
  uVar5 = ASDCP::Dictionary::Type(MVar3);
  (**(code **)(*plVar4 + 0xb0))(local_88,plVar4,uVar5,&local_a0);
  Kumu::Result_t::~Result_t(local_88);
  pplVar2 = local_a0;
  if ((long ***)local_a0 == &local_a0) {
LAB_0010ec9e:
    return (long ***)pplVar2 != &local_a0;
  }
  if ((long **)local_98[2] == (long **)0x0) {
    *text_object = (GenericStreamTextBasedSet *)0x0;
  }
  else {
    pGVar6 = (GenericStreamTextBasedSet *)
             __dynamic_cast(local_98[2],&ASDCP::MXF::InterchangeObject::typeinfo,
                            &ASDCP::MXF::GenericStreamTextBasedSet::typeinfo,0);
    *text_object = pGVar6;
    ppplVar7 = (long ***)pplVar2;
    if (pGVar6 != (GenericStreamTextBasedSet *)0x0) {
      do {
        ppplVar1 = (long ***)*ppplVar7;
        operator_delete(ppplVar7,0x18);
        ppplVar7 = ppplVar1;
      } while (ppplVar1 != &local_a0);
      goto LAB_0010ec9e;
    }
  }
  __assert_fail("text_object != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-wrap.cpp"
                ,0x708,
                "bool get_current_dms_text_descriptor(AS_02::ISXD::MXFWriter &, ASDCP::MXF::GenericStreamTextBasedSet *&)"
               );
}

Assistant:

bool
get_current_dms_text_descriptor(AS_02::ISXD::MXFWriter& writer, ASDCP::MXF::GenericStreamTextBasedSet *&text_object)
{
  std::list<MXF::InterchangeObject*> object_list;
  writer.OP1aHeader().GetMDObjectsByType(DefaultSMPTEDict().ul(MDD_GenericStreamTextBasedSet), object_list);

  if ( object_list.empty() )
    {
      return false;
    }

  text_object = dynamic_cast<MXF::GenericStreamTextBasedSet*>(object_list.back());
  assert(text_object != 0);
  return true;
}